

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

bool capnp::IncomingRpcMessage::isShortLivedRpcMessage(Reader body)

{
  bool bVar1;
  ReaderFor<capnp::rpc::Message> RStack_38;
  
  AnyPointer::Reader::getAs<capnp::rpc::Message>(&RStack_38,(Reader *)&stack0x00000008);
  bVar1 = true;
  if (0xf < RStack_38._reader.dataSize) {
    bVar1 = (*RStack_38._reader.data & 0xfffe) != 2;
  }
  return bVar1;
}

Assistant:

bool IncomingRpcMessage::isShortLivedRpcMessage(AnyPointer::Reader body) {
  switch (body.getAs<rpc::Message>().which()) {
    case rpc::Message::CALL:
    case rpc::Message::RETURN:
      return false;
    default:
      return true;
  }
}